

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

UtxoJsonData * __thiscall
cfd::js::api::json::UtxoJsonData::GetScriptSigTemplateString_abi_cxx11_
          (UtxoJsonData *this,UtxoJsonData *obj)

{
  UtxoJsonData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->script_sig_template_);
  return this;
}

Assistant:

static std::string GetScriptSigTemplateString(  // line separate
      const UtxoJsonData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.script_sig_template_);
  }